

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::Header::readFrom(Header *this,IStream *is,int *version)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  pointer ppVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  mapped_type *ppAVar6;
  uint *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Attribute *attr;
  stringstream _iex_throw_s;
  iterator i;
  int size;
  char typeName [256];
  char name [256];
  int attrCount;
  undefined4 in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  IStream *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9f8;
  OpaqueAttribute *in_stack_fffffffffffffa00;
  key_type *in_stack_fffffffffffffa08;
  map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
  *in_stack_fffffffffffffa10;
  Attribute *local_4e0;
  stringstream local_4d8 [16];
  ostream local_4c8 [80];
  char *in_stack_fffffffffffffb88;
  char (*in_stack_fffffffffffffb90) [256];
  char *in_stack_fffffffffffffbb0;
  _Self local_350 [33];
  _Self local_248 [3];
  uint local_22c;
  char local_228 [256];
  char local_128 [268];
  int local_1c;
  uint *local_18;
  undefined8 local_10;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,(char *)0x12a041);
    if (local_128[0] == '\0') {
      if (local_1c == 0) {
        *(undefined1 *)(in_RDI + 0x30) = 1;
      }
      else {
        *(undefined1 *)(in_RDI + 0x30) = 0;
      }
      return;
    }
    local_1c = local_1c + 1;
    (anonymous_namespace)::checkIsNullTerminated<256ul>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,(char *)0x12a0b0);
    (anonymous_namespace)::checkIsNullTerminated<256ul>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffff9d0,
               (int *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    if ((int)local_22c < 0) break;
    Name::Name((Name *)in_stack_fffffffffffff9d0,
               (char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_248[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
         ::find((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
                 *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                (key_type *)0x12a168);
    local_350[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
         ::end((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
                *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    bVar1 = std::operator!=(local_248,local_350);
    if (bVar1) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>
                           *)0x12a1ad);
      iVar2 = (*ppVar4->second->_vptr_Attribute[2])();
      iVar2 = strncmp((char *)CONCAT44(extraout_var,iVar2),local_228,0x100);
      if (iVar2 != 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_4d8);
        poVar5 = std::operator<<(local_4c8,"Unexpected type for image attribute \"");
        poVar5 = std::operator<<(poVar5,local_128);
        std::operator<<(poVar5,"\".");
        uVar3 = __cxa_allocate_exception(0x48);
        Iex_3_3::InputExc::InputExc
                  ((InputExc *)in_stack_fffffffffffff9d0,
                   (stringstream *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
        __cxa_throw(uVar3,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
      }
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>
                           *)0x12a2c7);
      (*ppVar4->second->_vptr_Attribute[5])
                (ppVar4->second,local_10,(ulong)local_22c,(ulong)*local_18);
    }
    else {
      bVar1 = Attribute::knownType((char *)in_stack_fffffffffffffa00);
      if (bVar1) {
        local_4e0 = Attribute::newAttribute(in_stack_fffffffffffffbb0);
      }
      else {
        local_4e0 = (Attribute *)operator_new(0x40);
        OpaqueAttribute::OpaqueAttribute(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      }
      (*local_4e0->_vptr_Attribute[5])(local_4e0,local_10,(ulong)local_22c,(ulong)*local_18);
      Name::Name((Name *)in_stack_fffffffffffff9d0,
                 (char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      ppAVar6 = std::
                map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
                ::operator[](in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      *ppAVar6 = local_4e0;
    }
  }
  uVar3 = __cxa_allocate_exception(0x48);
  Iex_3_3::InputExc::InputExc
            ((InputExc *)in_stack_fffffffffffff9d0,
             (char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  __cxa_throw(uVar3,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
}

Assistant:

void
Header::readFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int& version)
{
    //
    // Read all attributes.
    //

    int attrCount = 0;

    while (true)
    {
        //
        // Read the name of the attribute.
        // A zero-length attribute name indicates the end of the header.
        //

        char name[Name::SIZE];
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            is, Name::MAX_LENGTH, name);

        if (name[0] == 0)
        {
            if (attrCount == 0)
                _readsNothing = true;
            else
                _readsNothing = false;
            break;
        }

        attrCount++;

        checkIsNullTerminated (name, "attribute name");

        //
        // Read the attribute type and the size of the attribute value.
        //

        char typeName[Name::SIZE];
        int  size;

        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            is, Name::MAX_LENGTH, typeName);
        checkIsNullTerminated (typeName, "attribute type name");
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, size);

        if (size < 0)
        {
            throw IEX_NAMESPACE::InputExc (
                "Invalid size field in header attribute");
        }

        AttributeMap::iterator i = _map.find (name);

        if (i != _map.end ())
        {
            //
            // The attribute already exists (for example,
            // because it is a predefined attribute).
            // Read the attribute's new value from the file.
            //

            if (strncmp (i->second->typeName (), typeName, sizeof (typeName)))
                THROW (
                    IEX_NAMESPACE::InputExc,
                    "Unexpected type for image attribute "
                    "\"" << name
                         << "\".");

            i->second->readValueFrom (is, size, version);
        }
        else
        {
            //
            // The new attribute does not exist yet.
            // If the attribute type is of a known type,
            // read the attribute value.  If the attribute
            // is of an unknown type, read its value and
            // store it as an OpaqueAttribute.
            //

            Attribute* attr;

            if (Attribute::knownType (typeName))
                attr = Attribute::newAttribute (typeName);
            else
                attr = new OpaqueAttribute (typeName);

            try
            {
                attr->readValueFrom (is, size, version);
                _map[name] = attr;
            }
            catch (...)
            {
                delete attr;
                throw;
            }
        }
    }
}